

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConditionalPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPatternSyntax,slang::syntax::ConditionalPatternSyntax_const&>
          (BumpAllocator *this,ConditionalPatternSyntax *args)

{
  SyntaxNode *pSVar1;
  ExpressionSyntax *pEVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  ConditionalPatternSyntax *pCVar5;
  
  pCVar5 = (ConditionalPatternSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalPatternSyntax *)this->endPtr < pCVar5 + 1) {
    pCVar5 = (ConditionalPatternSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pCVar5 + 1);
  }
  pCVar5->matchesClause = args->matchesClause;
  SVar3 = (args->super_SyntaxNode).kind;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pEVar2 = (args->expr).ptr;
  (pCVar5->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  (pCVar5->expr).ptr = pEVar2;
  (pCVar5->super_SyntaxNode).kind = SVar3;
  *(undefined4 *)&(pCVar5->super_SyntaxNode).field_0x4 = uVar4;
  (pCVar5->super_SyntaxNode).parent = pSVar1;
  return pCVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }